

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O1

SPIRExpression * __thiscall
spirv_cross::CompilerGLSL::emit_op
          (CompilerGLSL *this,uint32_t result_type,uint32_t result_id,string *rhs,bool forwarding,
          bool suppress_usage_tracking)

{
  ulong uVar1;
  _Hash_node_base *p_Var2;
  uint32_t id;
  SPIRExpression *pSVar3;
  ulong uVar4;
  undefined7 in_register_00000081;
  __node_base_ptr p_Var5;
  __node_base_ptr p_Var6;
  __node_gen_type __node_gen;
  uint32_t local_4c;
  bool local_45;
  uint32_t local_44;
  string local_40;
  
  local_4c = result_id;
  local_44 = result_type;
  if ((int)CONCAT71(in_register_00000081,forwarding) != 0) {
    uVar1 = (this->super_Compiler).forced_temporaries._M_h._M_bucket_count;
    uVar4 = (ulong)result_id % uVar1;
    p_Var5 = (this->super_Compiler).forced_temporaries._M_h._M_buckets[uVar4];
    p_Var6 = (__node_base_ptr)0x0;
    if ((p_Var5 != (__node_base_ptr)0x0) &&
       (p_Var2 = p_Var5->_M_nxt, p_Var6 = p_Var5,
       *(uint32_t *)&p_Var5->_M_nxt[1]._M_nxt != result_id)) {
      while (p_Var5 = p_Var2, p_Var2 = p_Var5->_M_nxt, p_Var2 != (_Hash_node_base *)0x0) {
        p_Var6 = (__node_base_ptr)0x0;
        if (((ulong)*(uint *)&p_Var2[1]._M_nxt % uVar1 != uVar4) ||
           (p_Var6 = p_Var5, *(uint *)&p_Var2[1]._M_nxt == result_id)) goto LAB_001e590f;
      }
      p_Var6 = (__node_base_ptr)0x0;
    }
LAB_001e590f:
    if ((p_Var6 == (__node_base_ptr)0x0) || (p_Var6->_M_nxt == (_Hash_node_base *)0x0)) {
      local_40._M_dataplus._M_p = (pointer)&(this->super_Compiler).forwarded_temporaries;
      ::std::
      _Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
      ::
      _M_insert<unsigned_int_const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<unsigned_int,false>>>>
                ((_Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                  *)local_40._M_dataplus._M_p,&local_4c);
      if (suppress_usage_tracking) {
        local_40._M_dataplus._M_p = (pointer)&(this->super_Compiler).suppressed_usage_tracking;
        ::std::
        _Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
        ::
        _M_insert<unsigned_int_const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<unsigned_int,false>>>>
                  ((_Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                    *)local_40._M_dataplus._M_p,&local_4c);
      }
      local_40._M_dataplus._M_p._0_1_ = 1;
      pSVar3 = Compiler::
               set<spirv_cross::SPIRExpression,std::__cxx11::string_const&,unsigned_int&,bool>
                         (&this->super_Compiler,local_4c,rhs,&local_44,(bool *)&local_40);
      return pSVar3;
    }
  }
  declare_temporary_abi_cxx11_(&local_40,this,result_type,result_id);
  statement<std::__cxx11::string,std::__cxx11::string_const&,char_const(&)[2]>
            (this,&local_40,rhs,(char (*) [2])0x347553);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p);
  }
  id = local_4c;
  (*(this->super_Compiler)._vptr_Compiler[6])(&local_40,this,(ulong)local_4c,1);
  local_45 = true;
  pSVar3 = Compiler::set<spirv_cross::SPIRExpression,std::__cxx11::string,unsigned_int&,bool>
                     (&this->super_Compiler,id,&local_40,&local_44,&local_45);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p);
  }
  return pSVar3;
}

Assistant:

SPIRExpression &CompilerGLSL::emit_op(uint32_t result_type, uint32_t result_id, const string &rhs, bool forwarding,
                                      bool suppress_usage_tracking)
{
	if (forwarding && (forced_temporaries.find(result_id) == end(forced_temporaries)))
	{
		// Just forward it without temporary.
		// If the forward is trivial, we do not force flushing to temporary for this expression.
		forwarded_temporaries.insert(result_id);
		if (suppress_usage_tracking)
			suppressed_usage_tracking.insert(result_id);

		return set<SPIRExpression>(result_id, rhs, result_type, true);
	}
	else
	{
		// If expression isn't immutable, bind it to a temporary and make the new temporary immutable (they always are).
		statement(declare_temporary(result_type, result_id), rhs, ";");
		return set<SPIRExpression>(result_id, to_name(result_id), result_type, true);
	}
}